

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# watch_list.h
# Opt level: O2

void watch_list_remove(watch_list *wl,uint cref,uint is_bin)

{
  watcher *pwVar1;
  watcher wVar2;
  uint uVar3;
  uint uVar4;
  
  pwVar1 = wl->watchers;
  if (is_bin == 0) {
    uVar3 = wl->n_bin;
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 + 1;
    } while (pwVar1[uVar4].cref != cref);
    if (wl->size <= uVar4) {
      uVar3 = 0x75;
      goto LAB_0072d524;
    }
    wVar2 = pwVar1[uVar4];
    pwVar1[uVar4] = pwVar1[wl->size - 1];
    wl->watchers[wl->size - 1] = wVar2;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 + 1;
    } while (pwVar1[uVar4].cref != cref);
    if (wl->size <= uVar4) {
      uVar3 = 0x6f;
LAB_0072d524:
      __assert_fail("i < watch_list_size(wl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                    ,uVar3,"void watch_list_remove(struct watch_list *, unsigned int, unsigned int)"
                   );
    }
    wl->n_bin = wl->n_bin - 1;
    memmove(pwVar1 + uVar4,pwVar1 + (ulong)uVar4 + 1,(ulong)(wl->size - (uVar4 + 1)) << 3);
  }
  wl->size = wl->size - 1;
  return;
}

Assistant:

static inline void watch_list_remove(struct watch_list *wl, unsigned cref, unsigned is_bin)
{
    struct watcher *watchers = watch_list_array(wl);
    unsigned i;
    if (is_bin) {
        for (i = 0; watchers[i].cref != cref; i++);
        assert(i < watch_list_size(wl));
        wl->n_bin--;
        memmove((wl->watchers + i), (wl->watchers + i + 1),
                (wl->size - i - 1) * sizeof(struct watcher));
    } else {
        for (i = wl->n_bin; watchers[i].cref != cref; i++);
        assert(i < watch_list_size(wl));
        stk_swap(struct watcher, wl->watchers[i], wl->watchers[wl->size - 1]);
    }
    wl->size -= 1;
}